

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName(string *filename)

{
  string *in_RDI;
  string basename;
  char in_stack_ffffffffffffffc7;
  char *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  StripProto((string *)basename.field_2._M_allocated_capacity);
  ReplaceCharacters(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  ReplaceCharacters(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  std::operator+(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string ModuleName(const std::string& filename) {
  std::string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}